

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O1

void pgetrast(char *fn,uchar *hd,float *bf,int sx,int sy,int r)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ssize_t sVar4;
  byte *pbVar5;
  ulong uVar6;
  uint extraout_EDX;
  int extraout_EDX_00;
  long extraout_RDX;
  ulong unaff_RBX;
  ulong uVar7;
  int *unaff_RBP;
  int iVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  byte *pbVar16;
  long lVar17;
  byte *pbVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  uchar c;
  byte bStack_d5;
  uint uStack_d4;
  ulong uStack_d0;
  long lStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  byte *pbStack_b0;
  byte *pbStack_a8;
  byte *pbStack_a0;
  code *pcStack_98;
  byte bStack_8d;
  uint uStack_8c;
  byte *pbStack_88;
  long lStack_80;
  ulong uStack_78;
  ulong uStack_70;
  byte *pbStack_68;
  float *pfStack_60;
  byte *pbStack_58;
  code *pcStack_50;
  byte local_45;
  uint local_44;
  byte *local_40;
  long local_38;
  
  uVar7 = (ulong)(uint)r;
  uVar6 = (ulong)(uint)sy;
  pbVar10 = (byte *)(ulong)(uint)sx;
  uVar13 = (ulong)(uint)r;
  pbVar9 = (byte *)(ulong)(uint)sy;
  pbVar16 = (byte *)0x0;
  pcStack_50 = (code *)0x102e5c;
  local_44 = sx;
  uVar1 = open(fn,0);
  pbVar18 = pbVar9;
  if ((int)uVar1 < 1) {
LAB_00102f06:
    pcStack_50 = (code *)0x102f0b;
    pgetrast_cold_1();
  }
  else {
    unaff_RBP = (int *)(ulong)uVar1;
    fn = (char *)(ulong)uVar1;
    pcStack_50 = (code *)0x102e75;
    pbVar16 = hd;
    sVar4 = read(uVar1,hd,0x20);
    if (sVar4 == 0x20) {
      if (0 < sy) {
        unaff_RBX = (ulong)local_44;
        local_38 = (long)r << 2;
        hd = (byte *)0x0;
        pbVar18 = &local_45;
        pbVar10 = pbVar9;
        local_40 = pbVar9;
        do {
          if (0 < (int)local_44) {
            uVar13 = 0;
            do {
              pcStack_50 = (code *)0x102ebd;
              pbVar16 = pbVar18;
              fn = (char *)unaff_RBP;
              sVar4 = read(uVar1,pbVar18,1);
              if (sVar4 != 1) {
                pcStack_50 = (code *)0x102f06;
                pgetrast_cold_3();
                goto LAB_00102f06;
              }
              bf[uVar13] = (float)local_45;
              uVar13 = uVar13 + 1;
            } while (unaff_RBX != uVar13);
          }
          hd = hd + 1;
          bf = (float *)((long)bf + local_38);
        } while (hd != local_40);
      }
      close(uVar1);
      return;
    }
  }
  pcStack_50 = Bpgetrast;
  pgetrast_cold_2();
  uVar14 = uVar6 & 0xffffffff;
  pbVar5 = (byte *)((ulong)pbVar10 & 0xffffffff);
  pbVar9 = (byte *)0x0;
  pcStack_98 = (code *)0x102f34;
  uVar15 = uVar6;
  uVar1 = (uint)pbVar10;
  uStack_8c = extraout_EDX;
  uStack_78 = unaff_RBX;
  uStack_70 = uVar13;
  pbStack_68 = hd;
  pfStack_60 = bf;
  pbStack_58 = pbVar18;
  pcStack_50 = (code *)unaff_RBP;
  uVar2 = open(fn,0);
  uVar3 = (uint)uVar15;
  iVar11 = (int)uVar7;
  pbVar18 = pbVar5;
  if (0 < (int)uVar2) {
    unaff_RBP = (int *)(ulong)uVar2;
    if (0 < (int)(uint)pbVar10) {
      unaff_RBX = (ulong)uStack_8c;
      lStack_80 = (long)(int)uVar6 << 2;
      hd = (byte *)0x0;
      pbVar18 = &bStack_8d;
      pbStack_88 = pbVar5;
      do {
        if (0 < (int)uStack_8c) {
          uVar14 = 0;
          do {
            pcStack_98 = (code *)0x102f7c;
            pbVar9 = pbVar18;
            fn = (char *)unaff_RBP;
            sVar4 = read(uVar2,pbVar18,1);
            uVar1 = (uint)pbVar5;
            uVar3 = (uint)uVar15;
            iVar11 = (int)uVar7;
            if (sVar4 != 1) {
              pcStack_98 = (code *)0x102fc5;
              Bpgetrast_cold_2();
              goto LAB_00102fc5;
            }
            *(float *)(pbVar16 + uVar14 * 4) = (float)bStack_8d;
            uVar14 = uVar14 + 1;
          } while (unaff_RBX != uVar14);
        }
        hd = hd + 1;
        pbVar16 = pbVar16 + lStack_80;
      } while (hd != pbStack_88);
    }
    close(uVar2);
    return;
  }
LAB_00102fc5:
  pcStack_98 = pputrast;
  Bpgetrast_cold_1();
  uVar6 = (ulong)uVar3;
  pbVar10 = (byte *)0x180;
  uStack_d4 = uVar1;
  uStack_c0 = unaff_RBX;
  uStack_b8 = uVar14;
  pbStack_b0 = hd;
  pbStack_a8 = pbVar16;
  pbStack_a0 = pbVar18;
  pcStack_98 = (code *)unaff_RBP;
  uVar2 = creat(fn,0x180);
  if ((int)uVar2 < 1) {
LAB_00103094:
    pputrast_cold_1();
  }
  else {
    fn = (char *)(ulong)uVar2;
    sVar4 = write(uVar2,pbVar9,0x20);
    pbVar10 = pbVar9;
    if (sVar4 == 0x20) {
      if (0 < (int)uVar3) {
        uVar7 = (ulong)uStack_d4;
        lStack_c8 = (long)iVar11 << 2;
        uVar13 = 0;
        lVar17 = extraout_RDX;
        uStack_d0 = uVar6;
        do {
          if (0 < (int)uStack_d4) {
            uVar15 = 0;
            do {
              bStack_d5 = (byte)(int)*(float *)(lVar17 + uVar15 * 4);
              fn = (char *)(ulong)uVar2;
              pbVar10 = &bStack_d5;
              sVar4 = write(uVar2,&bStack_d5,1);
              uVar1 = (uint)uVar6;
              if (sVar4 != 1) {
                pputrast_cold_3();
                goto LAB_00103094;
              }
              uVar15 = uVar15 + 1;
            } while (uVar7 != uVar15);
          }
          uVar13 = uVar13 + 1;
          lVar17 = lVar17 + lStack_c8;
        } while (uVar13 != uStack_d0);
      }
      close(uVar2);
      return;
    }
  }
  pputrast_cold_2();
  if (0 < (int)uVar1) {
    uVar3 = 0;
    iVar11 = extraout_EDX_00;
    uVar2 = uVar1;
    do {
      do {
        iVar8 = (int)pbVar10;
        *(ulong *)(*(long *)((long)fn + 0x158) + (long)(*(int *)fn * iVar8 + iVar11) * 8) =
             CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        lVar17 = *(long *)((long)fn + ((long)(*(int *)((long)fn + 0xc) / 2) * 2 + 0x2e) * 4);
        lVar12 = (long)(*(int *)fn * iVar8 + iVar11) * 0x30;
        *(float *)(lVar17 + 0x24 + lVar12) = (float)(double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
        *(float *)(lVar17 + 0x28 + lVar12) = (float)(double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
        iVar11 = iVar11 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      uVar3 = uVar3 + 1;
      pbVar10 = (byte *)(ulong)(iVar8 + 1);
      iVar11 = extraout_EDX_00;
      uVar2 = uVar1;
    } while (uVar3 != uVar1);
  }
  return;
}

Assistant:

void pgetrast(fn,hd,bf,sx,sy,r)
char *fn ;
unsigned char hd[H] ;
float bf[X*Y] ;
int sx, sy, r ;

{ int fd, i, j ;
  unsigned char c ;

  if ((fd = open(fn,O_RDONLY)) > 0) { ;
    if (read(fd,hd,H) == H) {
      for (i = 0 ; i < sy ; i++) {
        for (j = 0 ; j < sx ; j++) {
          if (read(fd,&c,sizeof(c)) != 1) {
            error(4) ;
          }
          bf[r*i + j] = (float)c ;
        }
      }
    }
    else {
      error(5) ;
    }
  }
  else {
    error(6) ;
  }
  close(fd) ;
}